

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

void __thiscall Tokenizer::Tokenizer(Tokenizer *this)

{
  allocator<char> local_41;
  string local_40 [32];
  
  (this->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  (this->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  *(__index_type *)
   ((long)&(this->invalidToken).value.
           super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
           super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
           super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
           super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
           super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier> + 0x20) =
       '\0';
  (this->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node._M_size = 0;
  (this->position).it._M_node = (_List_node_base *)0x0;
  (this->invalidToken).line = 0;
  (this->invalidToken).column = 0;
  *(undefined8 *)((long)&(this->invalidToken).column + 5) = 0;
  (this->invalidToken).originalText._M_dataplus._M_p =
       (pointer)&(this->invalidToken).originalText.field_2;
  (this->invalidToken).originalText._M_string_length = 0;
  (this->invalidToken).originalText.field_2._M_local_buf[0] = '\0';
  (this->replacements).
  super__Vector_base<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->replacements).
  super__Vector_base<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->replacements).
  super__Vector_base<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->position).it._M_node = (_List_node_base *)this;
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"Unexpected end of token stream",&local_41);
  Token::setValue<std::monostate>(&this->invalidToken,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

Tokenizer::Tokenizer()
{
	position.it = tokens.begin();
	invalidToken.type = TokenType::Invalid;
	invalidToken.setValue(std::monostate{}, "Unexpected end of token stream");
}